

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_instruction.cpp
# Opt level: O0

spv_result_t
spvtools::val::anon_unknown_2::CheckIfKnownExtension(ValidationState_t *_,Instruction *inst)

{
  bool bVar1;
  spv_parsed_instruction_t *this;
  char *str;
  DiagnosticStream *pDVar2;
  spv_parsed_instruction_t *inst_00;
  DiagnosticStream local_220;
  Extension local_44;
  undefined1 local_40 [4];
  Extension extension;
  string extension_str;
  Instruction *inst_local;
  ValidationState_t *__local;
  
  extension_str.field_2._8_8_ = inst;
  this = val::Instruction::c_inst(inst);
  GetExtensionString_abi_cxx11_((string *)local_40,(spvtools *)this,inst_00);
  str = (char *)std::__cxx11::string::c_str();
  bVar1 = GetExtensionFromString(str,&local_44);
  if (bVar1) {
    __local._4_4_ = SPV_SUCCESS;
  }
  else {
    ValidationState_t::diag(&local_220,_,SPV_WARNING,(Instruction *)extension_str.field_2._8_8_);
    pDVar2 = DiagnosticStream::operator<<(&local_220,(char (*) [30])"Found unrecognized extension ")
    ;
    pDVar2 = DiagnosticStream::operator<<
                       (pDVar2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_40);
    __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar2);
    DiagnosticStream::~DiagnosticStream(&local_220);
  }
  std::__cxx11::string::~string((string *)local_40);
  return __local._4_4_;
}

Assistant:

spv_result_t CheckIfKnownExtension(ValidationState_t& _,
                                   const Instruction* inst) {
  const std::string extension_str = GetExtensionString(&(inst->c_inst()));
  Extension extension;
  if (!GetExtensionFromString(extension_str.c_str(), &extension)) {
    return _.diag(SPV_WARNING, inst)
           << "Found unrecognized extension " << extension_str;
  }
  return SPV_SUCCESS;
}